

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loggingTest2.cpp
# Opt level: O2

void __thiscall LogTest2::Run(LogTest2 *this)

{
  int iVar1;
  
  iVar1 = this->mTest;
  if (iVar1 == 3) {
    Test3(this);
  }
  else if (iVar1 == 2) {
    Test2(this);
  }
  else if (iVar1 == 1) {
    Test1(this);
  }
  TestCase::TestPassed(&this->super_TestCase);
  return;
}

Assistant:

void LogTest2::Run()
{
	
	LOG_NOTICE( "LogTest2 Started" ); // Ignore this for now.
	switch( mTest )
	{
	case 1:
		Test1();
		break;
	case 2:
		Test2();
		break;
	case 3:
		Test3();
		break;
	}

	TestPassed();
}